

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  byte bVar1;
  U32 UVar2;
  char cVar3;
  BYTE BVar4;
  size_t rankValOrigin;
  DTableDesc DVar5;
  uint targetLog;
  uint uVar6;
  HUF_DEltX2 *DTable_00;
  U32 *rankStats_00;
  U32 *rankStart_00;
  sortedSymbol_t *sortedList;
  BYTE *huffWeight;
  U32 *pUVar7;
  HUF_DTable *code;
  ulong uVar8;
  uint local_e4;
  U32 w_3;
  U32 *rankValPtr;
  U32 consumed;
  U32 minBits;
  U32 current_1;
  U32 w_2;
  U32 nextRankVal;
  int rescale;
  U32 *rankVal0;
  U32 r;
  U32 w_1;
  U32 s;
  U32 current;
  U32 nextRankStart;
  U32 w;
  size_t spaceUsed32;
  BYTE *weightList;
  sortedSymbol_t *sortedSymbol;
  U32 *rankStart0;
  U32 *rankStats;
  rankValCol_t *rankVal;
  U32 *rankStart;
  HUF_DEltX2 *dt;
  void *dtPtr;
  size_t iSize;
  U32 maxTableLog;
  DTableDesc dtd;
  U32 nbSymbols;
  U32 sizeOfSort;
  U32 maxW;
  U32 tableLog;
  size_t wkspSize_local;
  void *workSpace_local;
  size_t srcSize_local;
  void *src_local;
  HUF_DTable *DTable_local;
  
  _maxW = wkspSize;
  wkspSize_local = (size_t)workSpace;
  workSpace_local = (void *)srcSize;
  srcSize_local = (size_t)src;
  src_local = DTable;
  DVar5 = HUF_getDTableDesc(DTable);
  rankValOrigin = wkspSize_local;
  targetLog = (uint)DVar5 & 0xff;
  DTable_00 = (HUF_DEltX2 *)((long)src_local + 4);
  rankStats_00 = (U32 *)(wkspSize_local + 0x270);
  rankStart_00 = (U32 *)(wkspSize_local + 0x2a4);
  sortedList = (sortedSymbol_t *)(wkspSize_local + 0x2dc);
  huffWeight = (BYTE *)(wkspSize_local + 0x4dc);
  if (_maxW < 0x5dc) {
    DTable_local = (HUF_DTable *)0xffffffffffffffd4;
  }
  else {
    pUVar7 = (U32 *)(wkspSize_local + 0x2a8);
    memset(rankStats_00,0,0x6c);
    if (targetLog < 0xd) {
      code = (HUF_DTable *)
             HUF_readStats(huffWeight,0x100,rankStats_00,&maxTableLog,&sizeOfSort,
                           (void *)srcSize_local,(size_t)workSpace_local);
      uVar6 = ERR_isError((size_t)code);
      DTable_local = code;
      if (uVar6 == 0) {
        if (targetLog < sizeOfSort) {
          DTable_local = (HUF_DTable *)0xffffffffffffffd4;
        }
        else {
          for (nbSymbols = sizeOfSort; rankStats_00[nbSymbols] == 0; nbSymbols = nbSymbols - 1) {
          }
          s = 0;
          for (current = 1; current < nbSymbols + 1; current = current + 1) {
            uVar8 = (ulong)current;
            pUVar7[current] = s;
            s = rankStats_00[uVar8] + s;
          }
          *pUVar7 = s;
          dtd.maxTableLog = (undefined1)s;
          dtd.tableType = s._1_1_;
          dtd.tableLog = s._2_1_;
          dtd.reserved = s._3_1_;
          for (r = 0; r < maxTableLog; r = r + 1) {
            bVar1 = huffWeight[r];
            uVar6 = pUVar7[bVar1];
            pUVar7[bVar1] = uVar6 + 1;
            sortedList[uVar6].symbol = (BYTE)r;
            *(byte *)(rankValOrigin + 0x2dd + (ulong)uVar6 * 2) = bVar1;
          }
          *pUVar7 = 0;
          BVar4 = DVar5.maxTableLog;
          current_1 = 0;
          for (minBits = 1; minBits < nbSymbols + 1; minBits = minBits + 1) {
            UVar2 = rankStats_00[minBits];
            cVar3 = (char)minBits;
            *(U32 *)(rankValOrigin + (ulong)minBits * 4) = current_1;
            current_1 = (UVar2 << (cVar3 + (BVar4 - (char)sizeOfSort) + -1 & 0x1f)) + current_1;
          }
          uVar6 = (sizeOfSort + 1) - nbSymbols;
          for (rankValPtr._0_4_ = uVar6; (uint)rankValPtr < (targetLog - uVar6) + 1;
              rankValPtr._0_4_ = (uint)rankValPtr + 1) {
            for (local_e4 = 1; local_e4 < nbSymbols + 1; local_e4 = local_e4 + 1) {
              *(uint *)(rankValOrigin + (ulong)(uint)rankValPtr * 0x34 + (ulong)local_e4 * 4) =
                   *(uint *)(rankValOrigin + (ulong)local_e4 * 4) >> ((byte)(uint)rankValPtr & 0x1f)
              ;
            }
          }
          HUF_fillDTableX2(DTable_00,targetLog,sortedList,s,rankStart_00,
                           (rankValCol_t *)rankValOrigin,nbSymbols,sizeOfSort + 1);
          iSize._7_1_ = DVar5.reserved;
          iSize._4_4_ = CONCAT22(CONCAT11(iSize._7_1_,BVar4),CONCAT11(1,BVar4));
          *(undefined4 *)src_local = iSize._4_4_;
        }
      }
    }
    else {
      DTable_local = (HUF_DTable *)0xffffffffffffffd4;
    }
  }
  return (size_t)DTable_local;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable,
                       const void* src, size_t srcSize,
                             void* workSpace, size_t wkspSize)
{
    U32 tableLog, maxW, sizeOfSort, nbSymbols;
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    U32 const maxTableLog = dtd.maxTableLog;
    size_t iSize;
    void* dtPtr = DTable+1;   /* force compiler to avoid strict-aliasing */
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;
    U32 *rankStart;

    rankValCol_t* rankVal;
    U32* rankStats;
    U32* rankStart0;
    sortedSymbol_t* sortedSymbol;
    BYTE* weightList;
    size_t spaceUsed32 = 0;

    rankVal = (rankValCol_t *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += (sizeof(rankValCol_t) * HUF_TABLELOG_MAX) >> 2;
    rankStats = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_MAX + 1;
    rankStart0 = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_MAX + 2;
    sortedSymbol = (sortedSymbol_t *)workSpace + (spaceUsed32 * sizeof(U32)) / sizeof(sortedSymbol_t);
    spaceUsed32 += HUF_ALIGN(sizeof(sortedSymbol_t) * (HUF_SYMBOLVALUE_MAX + 1), sizeof(U32)) >> 2;
    weightList = (BYTE *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += HUF_ALIGN(HUF_SYMBOLVALUE_MAX + 1, sizeof(U32)) >> 2;

    if ((spaceUsed32 << 2) > wkspSize) return ERROR(tableLog_tooLarge);

    rankStart = rankStart0 + 1;
    memset(rankStats, 0, sizeof(U32) * (2 * HUF_TABLELOG_MAX + 2 + 1));

    DEBUG_STATIC_ASSERT(sizeof(HUF_DEltX2) == sizeof(HUF_DTable));   /* if compiler fails here, assertion is wrong */
    if (maxTableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    /* memset(weightList, 0, sizeof(weightList)); */  /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats(weightList, HUF_SYMBOLVALUE_MAX + 1, rankStats, &nbSymbols, &tableLog, src, srcSize);
    if (HUF_isError(iSize)) return iSize;

    /* check result */
    if (tableLog > maxTableLog) return ERROR(tableLog_tooLarge);   /* DTable can't fit code depth */

    /* find maxWeight */
    for (maxW = tableLog; rankStats[maxW]==0; maxW--) {}  /* necessarily finds a solution before 0 */

    /* Get start index of each weight */
    {   U32 w, nextRankStart = 0;
        for (w=1; w<maxW+1; w++) {
            U32 current = nextRankStart;
            nextRankStart += rankStats[w];
            rankStart[w] = current;
        }
        rankStart[0] = nextRankStart;   /* put all 0w symbols at the end of sorted list*/
        sizeOfSort = nextRankStart;
    }

    /* sort symbols by weight */
    {   U32 s;
        for (s=0; s<nbSymbols; s++) {
            U32 const w = weightList[s];
            U32 const r = rankStart[w]++;
            sortedSymbol[r].symbol = (BYTE)s;
            sortedSymbol[r].weight = (BYTE)w;
        }
        rankStart[0] = 0;   /* forget 0w symbols; this is beginning of weight(1) */
    }

    /* Build rankVal */
    {   U32* const rankVal0 = rankVal[0];
        {   int const rescale = (maxTableLog-tableLog) - 1;   /* tableLog <= maxTableLog */
            U32 nextRankVal = 0;
            U32 w;
            for (w=1; w<maxW+1; w++) {
                U32 current = nextRankVal;
                nextRankVal += rankStats[w] << (w+rescale);
                rankVal0[w] = current;
        }   }
        {   U32 const minBits = tableLog+1 - maxW;
            U32 consumed;
            for (consumed = minBits; consumed < maxTableLog - minBits + 1; consumed++) {
                U32* const rankValPtr = rankVal[consumed];
                U32 w;
                for (w = 1; w < maxW+1; w++) {
                    rankValPtr[w] = rankVal0[w] >> consumed;
    }   }   }   }

    HUF_fillDTableX2(dt, maxTableLog,
                   sortedSymbol, sizeOfSort,
                   rankStart0, rankVal, maxW,
                   tableLog+1);

    dtd.tableLog = (BYTE)maxTableLog;
    dtd.tableType = 1;
    memcpy(DTable, &dtd, sizeof(dtd));
    return iSize;
}